

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# req.c
# Opt level: O2

void req0_run_send_queue(req0_sock *s,nni_aio_completions *sent_list)

{
  nni_list *list;
  nni_aio *aio;
  int iVar1;
  void *item;
  undefined8 *item_00;
  
  list = &s->ready_pipes;
  while( true ) {
    item = nni_list_first(&s->send_queue);
    if (item == (void *)0x0) {
      return;
    }
    item_00 = (undefined8 *)nni_list_first(list);
    if (item_00 == (undefined8 *)0x0) break;
    nni_list_remove(&s->send_queue,item);
    if (0 < *(int *)((long)item + 0x78)) {
      nni_list_node_remove((nni_list_node *)((long)item + 0x38));
      nni_list_append(&s->retry_queue,item);
    }
    nni_list_node_remove((nni_list_node *)((long)item + 0x28));
    nni_list_append((nni_list *)(item_00 + 4),item);
    nni_list_remove(list,item_00);
    nni_list_append(&s->busy_pipes,item_00);
    iVar1 = nni_list_empty(list);
    if (iVar1 != 0) {
      nni_pollable_clear(&s->writable);
    }
    aio = *(nni_aio **)((long)item + 0x58);
    if (aio != (nni_aio *)0x0) {
      *(undefined8 *)((long)item + 0x58) = 0;
      nni_aio_bump_count(aio,*(size_t *)((long)item + 0x68));
      if (sent_list == (nni_aio_completions *)0x0) {
        nni_aio_finish(aio,NNG_OK,0);
      }
      else {
        nni_aio_completions_add(sent_list,aio,NNG_OK,0);
      }
    }
    if (0 < *(int *)((long)item + 0x78)) {
      nni_msg_clone(*(nni_msg **)((long)item + 0x60));
    }
    nni_aio_set_msg((nni_aio *)(item_00 + 8),*(nni_msg **)((long)item + 0x60));
    nni_pipe_send((nni_pipe *)*item_00,(nni_aio *)(item_00 + 8));
  }
  return;
}

Assistant:

static void
req0_run_send_queue(req0_sock *s, nni_aio_completions *sent_list)
{
	req0_ctx *ctx;
	nni_aio  *aio;

	// Note: This routine should be called with the socket lock held.
	while ((ctx = nni_list_first(&s->send_queue)) != NULL) {
		req0_pipe *p;

		if ((p = nni_list_first(&s->ready_pipes)) == NULL) {
			return;
		}

		// We have a place to send it, so send it.
		// If a sending error occurs that causes the message to
		// be dropped, we rely on the resend timer to pick it up.
		// We also notify the completion callback if this is the
		// first send attempt.
		nni_list_remove(&s->send_queue, ctx);

		// Schedule a retry.  We only do this if we got
		// a pipe to send to.  Otherwise, we should get handled
		// the next time that the send_queue is run.  We don't do this
		// if the retry is "disabled" with NNG_DURATION_INFINITE.
		if (ctx->retry > 0) {
			nni_list_node_remove(&ctx->retry_node);
			nni_list_append(&s->retry_queue, ctx);
		}

		// Put us on the pipe list of active contexts.
		// This gives the pipe a chance to kick a resubmit
		// if the pipe is removed.
		nni_list_node_remove(&ctx->pipe_node);
		nni_list_append(&p->contexts, ctx);

		nni_list_remove(&s->ready_pipes, p);
		nni_list_append(&s->busy_pipes, p);
		if (nni_list_empty(&s->ready_pipes)) {
			nni_pollable_clear(&s->writable);
		}

		if ((aio = ctx->send_aio) != NULL) {
			ctx->send_aio = NULL;
			nni_aio_bump_count(aio, ctx->req_len);
			// If the list was passed in, we want to do a
			// synchronous completion later.
			if (sent_list != NULL) {
				nni_aio_completions_add(sent_list, aio, 0, 0);
			} else {
				nni_aio_finish(aio, 0, 0);
			}
		}

		// At this point, we will never give this message back to
		// the user, so we don't have to worry about making it
		// unique.  We can freely clone it.
		// But only do so if we need to hang onto it (for potential retries)
		if (ctx->retry > 0) {
			nni_msg_clone(ctx->req_msg);
		}
		nni_aio_set_msg(&p->aio_send, ctx->req_msg);
		nni_pipe_send(p->pipe, &p->aio_send);
	}
}